

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O2

void __thiscall r_code::LObject::add_reference(LObject *this,Code *object)

{
  atomic_int_fast64_t *paVar1;
  value_type local_10;
  
  if (object != (Code *)0x0) {
    LOCK();
    paVar1 = &(object->super__Object).refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  local_10.object = &object->super__Object;
  std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::push_back
            (&(this->_references).m_vector,&local_10);
  core::P<r_code::Code>::~P(&local_10);
  return;
}

Assistant:

void add_reference(Code *object)
    {
        _references.push_back(object);
    }